

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::convertImageType(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  int iVar9;
  pointer pIVar10;
  type pIVar11;
  runtime_error *this_00;
  long in_RSI;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  undefined1 auVar12 [16];
  string nullSwizzle;
  unique_ptr<Image,_std::default_delete<Image>_> *newImage;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd58;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd60;
  unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
  *in_stack_fffffffffffffd68;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd70;
  uint *in_stack_fffffffffffffd80;
  uint *in_stack_fffffffffffffd88;
  allocator<char> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  unique_ptr<Image,_std::default_delete<Image>_> local_140;
  undefined1 local_138 [16];
  uint32_t local_128;
  uint32_t local_124;
  undefined1 local_118 [16];
  uint32_t local_108;
  uint32_t local_104;
  undefined1 local_f8 [16];
  uint32_t local_e8;
  uint32_t local_e4;
  undefined1 local_d8 [16];
  uint32_t local_c8;
  uint32_t local_c4;
  undefined1 local_b8 [16];
  uint32_t local_a8;
  uint32_t local_a4;
  undefined1 local_98 [16];
  uint32_t local_88;
  uint32_t local_84;
  undefined1 local_78 [16];
  uint32_t local_68;
  uint32_t local_64;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  
  iVar9 = *(int *)(in_RSI + 800);
  pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1187f7);
  iVar8 = (*pIVar10->_vptr_Image[5])();
  if (iVar9 == iVar8) {
    std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  }
  else {
    local_19 = 0;
    std::unique_ptr<Image,std::default_delete<Image>>::unique_ptr<std::default_delete<Image>,void>
              (in_stack_fffffffffffffd60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    std::allocator<char>::~allocator(&local_41);
    pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118873);
    iVar9 = (*pIVar10->_vptr_Image[6])();
    auVar6._8_8_ = local_138._8_8_;
    auVar6._0_8_ = local_138._0_8_;
    auVar5._8_8_ = local_118._8_8_;
    auVar5._0_8_ = local_118._0_8_;
    auVar4._8_8_ = local_f8._8_8_;
    auVar4._0_8_ = local_f8._0_8_;
    auVar3._8_8_ = local_d8._8_8_;
    auVar3._0_8_ = local_d8._0_8_;
    auVar2._8_8_ = local_b8._8_8_;
    auVar2._0_8_ = local_b8._0_8_;
    auVar1._8_8_ = local_98._8_8_;
    auVar1._0_8_ = local_98._0_8_;
    auVar12._8_8_ = local_78._8_8_;
    auVar12._0_8_ = local_78._0_8_;
    if (iVar9 == 2) {
      switch(*(undefined4 *)(in_RSI + 800)) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x487,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x11891c);
        local_64 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118948);
        local_68 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_short,1u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::
        unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>::
        ~unique_ptr((unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>
                     *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1189bd);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_78 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x16])(pIVar10,pIVar11,local_78._0_8_,local_78._8_8_);
        break;
      case 2:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118a39);
        local_84 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118a65);
        local_88 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_short,2u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::
        unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>::
        ~unique_ptr((unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>
                     *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118ada);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_98 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x17])(pIVar10,pIVar11,local_98._0_8_,local_98._8_8_);
        break;
      case 3:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118b56);
        local_a4 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118b82);
        local_a8 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_short,3u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::
        unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>::
        ~unique_ptr((unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>
                     *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118bf7);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x18])(pIVar10,pIVar11,local_b8._0_8_,local_b8._8_8_);
        break;
      case 4:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118c73);
        local_c4 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118c9f);
        local_c8 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_short,4u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::
        unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>::
        ~unique_ptr((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                     *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118d14);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x19])(pIVar10,pIVar11,local_d8._0_8_,local_d8._8_8_);
      }
    }
    else {
      local_78 = auVar12;
      local_98 = auVar1;
      local_b8 = auVar2;
      local_d8 = auVar3;
      local_f8 = auVar4;
      local_118 = auVar5;
      local_138 = auVar6;
      switch(*(undefined4 *)(in_RSI + 800)) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x49c,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118de9);
        local_e4 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118e15);
        local_e8 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_char,1u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        std::unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                       *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118e84);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x16])(pIVar10,pIVar11,local_f8._0_8_,local_f8._8_8_);
        break;
      case 2:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118ef4);
        local_104 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118f1a);
        local_108 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_char,2u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                       *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118f83);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_118 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x17])(pIVar10,pIVar11,local_118._0_8_,local_118._8_8_);
        break;
      case 3:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118ff3);
        local_124 = Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x119019);
        local_128 = Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_char,3u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                       *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x119082);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        local_138 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x18])(pIVar10,pIVar11,local_138._0_8_,local_138._8_8_);
        break;
      case 4:
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1190f2);
        Image::getWidth(pIVar10);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x119118);
        Image::getHeight(pIVar10);
        std::make_unique<ImageT<unsigned_char,4u>,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd60 = &local_140;
        std::unique_ptr<Image,std::default_delete<Image>>::operator=
                  (in_stack_fffffffffffffd70,
                   (unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                    *)in_stack_fffffffffffffd68);
        std::unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                       *)in_stack_fffffffffffffd60);
        pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                            ((unique_ptr<Image,_std::default_delete<Image>_> *)0x119181);
        pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                            (in_stack_fffffffffffffd60);
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        (*pIVar10->_vptr_Image[0x19])(pIVar10,pIVar11,auVar12._0_8_,auVar12._8_8_);
      }
    }
    bVar7 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x11920f);
    if (!bVar7) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Out of memory for image with new target type.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_19 = 1;
    std::__cxx11::string::~string(local_40);
    if ((local_19 & 1) == 0) {
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(in_stack_fffffffffffffd60);
    }
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (tuple<Image_*,_std::default_delete<Image>_>)
         in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Image>
toktxApp::convertImageType(unique_ptr<Image> pImage)
{
    // TODO: These copyTo's should be reversed. The image should have
    // a copy constructor for each componentCount src image.
    if (options.targetType != (int)pImage->getComponentCount()) {
        unique_ptr<Image> newImage;
        string nullSwizzle = "rgba";
        // The casts in the following copyTo* definitions only work
        // because, thanks to the switch, at runtime we always pass
        // the image type being cast to.
        if (pImage->getComponentSize() == 2) {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        } else {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        }
        if (newImage) {
             return newImage;
        } else {
            throw runtime_error(
                "Out of memory for image with new target type."
            );
        }
    }
    return pImage;
}